

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

void __thiscall
google::protobuf::io::AnnotationCollector::AnnotationCollector(AnnotationCollector *this)

{
  AnnotationCollector *this_local;
  
  this->_vptr_AnnotationCollector = (_func_int **)&PTR___cxa_pure_virtual_006f3758;
  return;
}

Assistant:

class LIBPROTOBUF_EXPORT AnnotationCollector {
 public:
  // Records that the bytes in file_path beginning with begin_offset and ending
  // before end_offset are associated with the SourceCodeInfo-style path.
  virtual void AddAnnotation(size_t begin_offset, size_t end_offset,
                             const string& file_path,
                             const std::vector<int>& path) = 0;

  virtual ~AnnotationCollector() {}
}